

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O3

void __thiscall TypeOpBranchind::printRaw(TypeOpBranchind *this,ostream *s,PcodeOp *op)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (s,(this->super_TypeOp).name._M_dataplus._M_p,
                      (this->super_TypeOp).name._M_string_length);
  uStack_18 = CONCAT17(0x20,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  Varnode::printRaw(*(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                     super__Vector_impl_data._M_start,s);
  return;
}

Assistant:

void TypeOpBranchind::printRaw(ostream &s,const PcodeOp *op)

{
  s << name << ' ';
  op->getIn(0)->printRaw(s);
}